

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_neon_rsb(TCGContext_conflict1 *tcg_ctx,int size,TCGv_i32 t0,TCGv_i32 t1)

{
  uintptr_t o;
  TCGTemp *local_18;
  TCGTemp *local_10;
  
  if (size == 2) {
    tcg_gen_sub_i32(tcg_ctx,t0,t1,t0);
    return;
  }
  local_18 = (TCGTemp *)(t1 + (long)tcg_ctx);
  local_10 = (TCGTemp *)(t0 + (long)tcg_ctx);
  tcg_gen_callN_aarch64(tcg_ctx,helper_neon_sub_u16_aarch64,local_10,2,&local_18);
  return;
}

Assistant:

static inline void gen_neon_rsb(TCGContext *tcg_ctx, int size, TCGv_i32 t0, TCGv_i32 t1)
{
    switch (size) {
    case 0: gen_helper_neon_sub_u8(tcg_ctx, t0, t1, t0); break;
    case 1: gen_helper_neon_sub_u16(tcg_ctx, t0, t1, t0); break;
    case 2: tcg_gen_sub_i32(tcg_ctx, t0, t1, t0); break;
    default: return;
    }
}